

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDeterministicKey.cpp
# Opt level: O2

bignum jbcoin::makeHash(Blob *pubGen,int seq,bignum *order)

{
  bool bVar1;
  array<unsigned_char,_41UL> *args;
  array<unsigned_char,_41UL> *extraout_RDX;
  int iVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  void *__src;
  array<unsigned_char,_41UL> buf;
  result_type root;
  long lVar2;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,seq);
  openssl::bignum::bignum((bignum *)pubGen);
  __src = (void *)*plVar4;
  lVar2 = plVar4[1];
  if (lVar2 - (long)__src != 0x21) {
    __assert_fail("pubGen.size() == 33",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/crypto/impl/GenerateDeterministicKey.cpp"
                  ,0x91,"bignum jbcoin::makeHash(const Blob &, int, const bignum &)");
  }
  iVar3 = 0;
  do {
    args = (array<unsigned_char,_41UL> *)(lVar2 - (long)__src);
    if (args != (array<unsigned_char,_41UL> *)0x0) {
      memmove((jbcoin *)&buf,__src,(size_t)args);
      args = extraout_RDX;
    }
    buf._M_elems[0x23] = (uchar)((ulong)order >> 8);
    buf._M_elems[0x24] = (uchar)order;
    buf._M_elems[0x25] = (uchar)((uint)iVar3 >> 0x18);
    buf._M_elems[0x26] = (uchar)((uint)iVar3 >> 0x10);
    buf._M_elems[0x27] = (uchar)((uint)iVar3 >> 8);
    buf._M_elems[0x28] = (uchar)iVar3;
    buf._M_elems[0x21] = (uchar)((ulong)order >> 0x18);
    buf._M_elems[0x22] = (uchar)((ulong)order >> 0x10);
    sha512Half_s<std::array<unsigned_char,41ul>>(&root,(jbcoin *)&buf,args);
    beast::secure_erase<void>((jbcoin *)&buf,0x29);
    openssl::bignum::assign((bignum *)pubGen,(uint8_t *)&root,0x20);
    beast::secure_erase<void>(&root,0x20);
    bVar1 = openssl::bignum::is_zero((bignum *)pubGen);
    if (!bVar1) {
      bVar1 = openssl::operator>=((bignum *)pubGen,(bignum *)&DAT_00305ac0);
      if (!bVar1) {
        return (bignum)(BIGNUM *)pubGen;
      }
    }
    __src = (void *)*plVar4;
    lVar2 = plVar4[1];
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

static bignum makeHash (Blob const& pubGen, int seq, bignum const& order)
{
    int subSeq = 0;

    bignum result;

    assert(pubGen.size() == 33);
    do
    {
        // buf: 0          pubGen             33 seq   37 subSeq  41
        //      |<--------------------------->|<------>|<-------->|
        std::array<std::uint8_t, 41> buf;
        std::copy (pubGen.begin(), pubGen.end(), buf.begin());
        copy_uint32 (buf.begin() + 33, seq);
        copy_uint32 (buf.begin() + 37, subSeq++);
        auto root = sha512Half_s(buf);
        beast::secure_erase(buf.data(), buf.size());
        result.assign (root.data(), root.size());
        beast::secure_erase(root.data(), root.size());
    }
    while (result.is_zero()  ||  result >= order);

    return result;
}